

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

void plutovg_path_cubic_to
               (plutovg_path_t *path,float x1,float y1,float x2,float y2,float x3,float y3)

{
  plutovg_path_element_t *ppVar1;
  
  if ((path->elements).size == 0) {
    ppVar1 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_MOVE_TO,1);
    *ppVar1 = (plutovg_path_element_t)0x0;
    (path->start_point).x = 0.0;
    (path->start_point).y = 0.0;
    path->num_contours = path->num_contours + 1;
  }
  ppVar1 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_CUBIC_TO,3);
  (ppVar1->point).x = x1;
  (ppVar1->point).y = y1;
  ppVar1[1].point.x = x2;
  *(float *)((long)ppVar1 + 0xc) = y2;
  ppVar1[2].point.x = x3;
  *(float *)((long)ppVar1 + 0x14) = y3;
  path->num_curves = path->num_curves + 1;
  return;
}

Assistant:

void plutovg_path_cubic_to(plutovg_path_t* path, float x1, float y1, float x2, float y2, float x3, float y3)
{
    if(path->elements.size == 0)
        plutovg_path_move_to(path, 0, 0);
    plutovg_path_element_t* elements = plutovg_path_add_command(path, PLUTOVG_PATH_COMMAND_CUBIC_TO, 3);
    elements[0].point = PLUTOVG_MAKE_POINT(x1, y1);
    elements[1].point = PLUTOVG_MAKE_POINT(x2, y2);
    elements[2].point = PLUTOVG_MAKE_POINT(x3, y3);
    path->num_curves += 1;
}